

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_movement
               (textblock *tb,monster_race *race,monster_lore_conflict *lore,bitflag *known_flags)

{
  uint8_t attr;
  _Bool _Var1;
  char *pcVar2;
  bitflag local_38 [7];
  uint8_t colour;
  bitflag flags [12];
  wchar_t f;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  unique0x100004b6 = known_flags;
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    textblock_append(tb,"This");
    create_mon_flag_mask(local_38,10,0xf);
    flag_inter(local_38,race->flags,0xc);
    for (flags._4_4_ = flag_next(local_38,0xc,1); flags._4_4_ != 0;
        flags._4_4_ = flag_next(local_38,0xc,flags._4_4_ + 1)) {
      pcVar2 = describe_race_flag(flags._4_4_);
      textblock_append_c(tb,'\x0e'," %s",pcVar2);
    }
    create_mon_flag_mask(local_38,9,0xf);
    flag_inter(local_38,race->flags,0xc);
    flags._4_4_ = flag_next(local_38,0xc,1);
    if (flags._4_4_ == L'\0') {
      textblock_append_c(tb,'\x0e'," creature");
    }
    else {
      pcVar2 = describe_race_flag(flags._4_4_);
      textblock_append_c(tb,'\x0e'," %s",pcVar2);
    }
    if (race->level == L'\0') {
      textblock_append(tb," lives in the town");
    }
    else {
      attr = '\x0e';
      if ((int)player->max_depth < race->level) {
        attr = '\x04';
      }
      _Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0xc,"known_flags","RF_FORCE_DEPTH");
      if (_Var1) {
        textblock_append(tb," is found ");
      }
      else {
        textblock_append(tb," is normally found ");
      }
      textblock_append(tb,"at a danger level of ");
      textblock_append_c(tb,attr,"%d",(ulong)(uint)race->level);
    }
    textblock_append(tb,", and moves");
    _Var1 = flags_test(stack0xffffffffffffffd8,0xc,0x1d,0x1c,0);
    if (_Var1) {
      _Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0x1d,"known_flags","RF_RAND_50");
      if ((_Var1) &&
         (_Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0x1c,"known_flags","RF_RAND_25"), _Var1))
      {
        textblock_append(tb," extremely");
      }
      else {
        _Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0x1d,"known_flags","RF_RAND_50");
        if (_Var1) {
          textblock_append(tb," somewhat");
        }
        else {
          _Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0x1c,"known_flags","RF_RAND_25");
          if (_Var1) {
            textblock_append(tb," a bit");
          }
        }
      }
      textblock_append(tb," erratically");
      if (race->speed != L'n') {
        textblock_append(tb,", and");
      }
    }
    textblock_append(tb," ");
    if (((player->opts).opt[0x15] & 1U) == 0) {
      lore_adjective_speed(tb,race);
    }
    else {
      lore_multiplier_speed(tb,race);
    }
    _Var1 = flag_has_dbg(stack0xffffffffffffffd8,0xc,0x1b,"known_flags","RF_NEVER_MOVE");
    if (_Var1) {
      textblock_append(tb,", but ");
      textblock_append_c(tb,'\r',"does not deign to chase intruders");
    }
    textblock_append(tb,".  ");
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x3cc,
                "void lore_append_movement(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_movement(textblock *tb, const struct monster_race *race,
						  const struct monster_lore *lore,
						  bitflag known_flags[RF_SIZE])
{
	int f;
	bitflag flags[RF_SIZE];

	assert(tb && race && lore);

	textblock_append(tb, "This");

	/* Get adjectives */
	create_mon_flag_mask(flags, RFT_RACE_A, RFT_MAX);
	rf_inter(flags, race->flags);
	for (f = rf_next(flags, FLAG_START); f; f = rf_next(flags, f + 1)) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	}

	/* Get noun */
	create_mon_flag_mask(flags, RFT_RACE_N, RFT_MAX);
	rf_inter(flags, race->flags);
	f = rf_next(flags, FLAG_START);
	if (f) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	} else {
		textblock_append_c(tb, COLOUR_L_BLUE, " creature");
	}

	/* Describe location */
	if (race->level == 0) {
		textblock_append(tb, " lives in the town");
	} else {
		uint8_t colour = (race->level > player->max_depth) ?
			COLOUR_RED : COLOUR_L_BLUE;

		if (rf_has(known_flags, RF_FORCE_DEPTH))
			textblock_append(tb, " is found ");
		else
			textblock_append(tb, " is normally found ");

		textblock_append(tb, "at a danger level of ");
		textblock_append_c(tb, colour, "%d", race->level);
	}

	textblock_append(tb, ", and moves");

	/* Random-ness */
	if (flags_test(known_flags, RF_SIZE, RF_RAND_50, RF_RAND_25, FLAG_END)) {
		/* Adverb */
		if (rf_has(known_flags, RF_RAND_50) && rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " extremely");
		else if (rf_has(known_flags, RF_RAND_50))
			textblock_append(tb, " somewhat");
		else if (rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " a bit");

		/* Adjective */
		textblock_append(tb, " erratically");

		/* Hack -- Occasional conjunction */
		if (race->speed != 110) textblock_append(tb, ", and");
	}

	/* Speed */
	textblock_append(tb, " ");

	if (OPT(player, effective_speed))
		lore_multiplier_speed(tb, race);
	else
		lore_adjective_speed(tb, race);

	/* The speed description also describes "attack speed" */
	if (rf_has(known_flags, RF_NEVER_MOVE)) {
		textblock_append(tb, ", but ");
		textblock_append_c(tb, COLOUR_L_GREEN,
						   "does not deign to chase intruders");
	}

	/* End this sentence */
	textblock_append(tb, ".  ");
}